

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-io.cpp
# Opt level: O1

void __thiscall
wasm::ModuleReader::readBinaryData
          (ModuleReader *this,vector<char,_std::allocator<char>_> *input,Module *wasm,
          string *sourceMapFilename)

{
  undefined8 uVar1;
  void *__buf;
  undefined1 auStack_428 [8];
  WasmBinaryReader parser;
  MixedArena *local_28;
  
  parser.hasDataCount = false;
  parser._1001_7_ = 0;
  local_28 = (MixedArena *)0x0;
  if (sourceMapFilename->_M_string_length != 0) {
    read_file<std::vector<char,std::allocator<char>>>
              ((vector<char,_std::allocator<char>_> *)auStack_428,(wasm *)sourceMapFilename,
               (string *)0x1,(BinaryOption)sourceMapFilename);
    uVar1 = parser._1000_8_;
    parser._1000_8_ = auStack_428;
    local_28 = parser.allocator;
    auStack_428 = (undefined1  [8])0x0;
    parser.wasm = (Module *)0x0;
    parser.allocator = (MixedArena *)0x0;
    if (uVar1 != 0) {
      operator_delete((void *)uVar1,-uVar1);
    }
    if (auStack_428 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_428,(long)parser.allocator - (long)auStack_428);
    }
  }
  WasmBinaryReader::WasmBinaryReader
            ((WasmBinaryReader *)auStack_428,wasm,(FeatureSet)(wasm->features).features,input,
             (vector<char,_std::allocator<char>_> *)&parser.hasDataCount);
  parser.input._0_1_ = *this;
  parser.input._1_1_ = this[1];
  parser.input._2_1_ = this[8];
  WasmBinaryReader::read((WasmBinaryReader *)auStack_428,(int)wasm,__buf,(size_t)input);
  WasmBinaryReader::~WasmBinaryReader((WasmBinaryReader *)auStack_428);
  if (parser._1000_8_ != 0) {
    operator_delete((void *)parser._1000_8_,(long)local_28 - parser._1000_8_);
  }
  return;
}

Assistant:

void ModuleReader::readBinaryData(std::vector<char>& input,
                                  Module& wasm,
                                  std::string sourceMapFilename) {
  std::vector<char> sourceMapBuffer;
  if (sourceMapFilename.size()) {
    sourceMapBuffer =
      read_file<std::vector<char>>(sourceMapFilename, Flags::Text);
  }
  // Assume that the wasm has had its initial features applied, and use those
  // while parsing.
  WasmBinaryReader parser(wasm, wasm.features, input, sourceMapBuffer);
  parser.setDebugInfo(debugInfo);
  parser.setDWARF(DWARF);
  parser.setSkipFunctionBodies(skipFunctionBodies);
  parser.read();
}